

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioWaveGetPulses(void)

{
  int iVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveGetPulses_cold_1();
  }
  iVar1 = wfStats_3;
  if ((libInitialised == '\0') && (iVar1 = -0x1f, (gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveGetPulses_cold_2();
  }
  return iVar1;
}

Assistant:

int gpioWaveGetPulses(void)
{
   DBG(DBG_USER, "");

   CHECK_INITED;

   return wfStats.pulses;
}